

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNTDG.cpp
# Opt level: O0

void __thiscall NaPNTrainDataGath::action(NaPNTrainDataGath *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  NaVector *pNVar6;
  NaVector *pNVar7;
  undefined4 extraout_var;
  size_type sVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  reference pvVar9;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  char *pcVar10;
  NaPetriNet *pNVar11;
  NaTimer *pNVar12;
  undefined4 extraout_var_09;
  NaPetriNode *in_RDI;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int i_3;
  int i_2;
  int i2_1;
  int i1_1;
  int i_1;
  int i2;
  int i1;
  int j;
  int i;
  NaPetriCnInput *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int local_10;
  int local_c;
  
  if (((ulong)in_RDI[9].pcaPorts._vptr_NaDynAr & 1) == 0) {
    iVar2 = NaPetriConnector::links((NaPetriConnector *)0x17a678);
    if (0 < iVar2) {
      pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff08);
      iVar2 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
      if ((*(double *)CONCAT44(extraout_var_09,iVar2) != 0.0) ||
         (NAN(*(double *)CONCAT44(extraout_var_09,iVar2)))) {
        *(undefined1 *)&in_RDI[9].pcaPorts._vptr_NaDynAr = 1;
        pcVar10 = NaPetriNode::name(in_RDI);
        pNVar11 = NaPetriNode::net(in_RDI);
        pNVar12 = NaPetriNet::timer(pNVar11);
        uVar3 = (*pNVar12->_vptr_NaTimer[5])();
        NaPrintLog("\'%s\' is ON (at %d)\n",pcVar10,(ulong)uVar3);
        for (iVar2 = 0; iVar2 < *(int *)&in_RDI[9].pcaPorts.pHead * *(int *)&in_RDI[10].bHalt;
            iVar2 = iVar2 + 1) {
          *(undefined4 *)((long)in_RDI[0xc]._vptr_NaPetriNode + (long)iVar2 * 4) = 0;
        }
        *(undefined4 *)&in_RDI[0xc].szName = 0;
        *(undefined8 *)&in_RDI[0xb].pcaPorts.nItems = 0;
        in_RDI[10].pNet = (NaPetriNet *)0x0;
        in_RDI[0xb].pcaPorts.pHead = (item *)0x0;
        in_RDI[10].pcaPorts._vptr_NaDynAr = (_func_int **)0x0;
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)0x17a7a3);
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)0x17a7bf);
      }
    }
  }
  else {
    pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff08);
    (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (value_type *)in_stack_ffffffffffffff08);
    pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff08);
    (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (value_type *)in_stack_ffffffffffffff08);
    pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff08);
    pNVar7 = NaPetriCnOutput::data((NaPetriCnOutput *)&in_RDI[5].bHalt);
    (*pNVar7->_vptr_NaVector[2])(pNVar7,pNVar6);
    pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff08);
    pNVar7 = NaPetriCnOutput::data((NaPetriCnOutput *)&in_RDI[7].pcaPorts.pHead);
    (*pNVar7->_vptr_NaVector[2])(pNVar7,pNVar6);
    pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 4));
    iVar2 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
    *(undefined8 *)CONCAT44(extraout_var,iVar2) = 0;
    NaPetriCnOutput::commit_data((NaPetriCnOutput *)0x179cf4);
    NaPetriCnOutput::commit_data((NaPetriCnOutput *)0x179d08);
    sVar8 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)&in_RDI[10].pcaPorts.nItems);
    if (sVar8 < (ulong)(long)*(int *)((long)&in_RDI[9].pcaPorts._vptr_NaDynAr + 4)) {
      pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff08);
      iVar2 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
      in_RDI[10].pNet =
           (NaPetriNet *)(*(double *)CONCAT44(extraout_var_00,iVar2) + (double)in_RDI[10].pNet);
      pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff08);
      iVar2 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
      dVar13 = *(double *)CONCAT44(extraout_var_01,iVar2);
      pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff08);
      iVar2 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
      in_RDI[10].pcaPorts._vptr_NaDynAr =
           (_func_int **)
           (dVar13 * *(double *)CONCAT44(extraout_var_02,iVar2) +
           (double)in_RDI[10].pcaPorts._vptr_NaDynAr);
      pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff08);
      iVar2 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
      *(double *)&in_RDI[0xb].pcaPorts.nItems =
           *(double *)CONCAT44(extraout_var_03,iVar2) + *(double *)&in_RDI[0xb].pcaPorts.nItems;
      pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff08);
      iVar2 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
      dVar13 = *(double *)CONCAT44(extraout_var_04,iVar2);
      pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff08);
      iVar2 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
      in_RDI[0xb].pcaPorts.pHead =
           (item *)(dVar13 * *(double *)CONCAT44(extraout_var_05,iVar2) +
                   (double)in_RDI[0xb].pcaPorts.pHead);
    }
    else {
      sVar8 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)&in_RDI[10].pcaPorts.nItems);
      if (sVar8 == (long)*(int *)((long)&in_RDI[9].pcaPorts._vptr_NaDynAr + 4)) {
        pcVar10 = NaPetriNode::name(in_RDI);
        pNVar11 = NaPetriNode::net(in_RDI);
        pNVar12 = NaPetriNet::timer(pNVar11);
        uVar3 = (*pNVar12->_vptr_NaTimer[5])();
        NaPrintLog("\'%s\' calculated statistics (at %d):\n",pcVar10,(ulong)uVar3);
        for (local_c = 0; local_c < 2; local_c = local_c + 1) {
          dVar13 = *(double *)((long)in_RDI + (long)local_c * 0x58 + 0x2e0);
          sVar8 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)
                             ((long)in_RDI + (long)local_c * 0x58 + 0x2f0));
          auVar15._8_4_ = (int)(sVar8 >> 0x20);
          auVar15._0_8_ = sVar8;
          auVar15._12_4_ = 0x45300000;
          *(double *)((long)in_RDI + (long)local_c * 0x58 + 0x2c0) =
               dVar13 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0));
          dVar13 = *(double *)((long)in_RDI + (long)local_c * 0x58 + 0x2e8);
          sVar8 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)
                             ((long)in_RDI + (long)local_c * 0x58 + 0x2f0));
          auVar14._8_4_ = (int)(sVar8 >> 0x20);
          auVar14._0_8_ = sVar8;
          auVar14._12_4_ = 0x45300000;
          dVar13 = sqrt(-*(double *)((long)in_RDI + (long)local_c * 0x58 + 0x2c0) *
                        *(double *)((long)in_RDI + (long)local_c * 0x58 + 0x2c0) +
                        dVar13 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0)));
          *(double *)((long)in_RDI + (long)local_c * 0x58 + 0x2c8) = dVar13;
          *(double *)((long)in_RDI + (long)local_c * 0x58 + 0x2d0) =
               -*(double *)((long)in_RDI + (long)local_c * 0x58 + 0x2b8) *
               *(double *)((long)in_RDI + (long)local_c * 0x58 + 0x2c8) +
               *(double *)((long)in_RDI + (long)local_c * 0x58 + 0x2c0);
          *(double *)((long)in_RDI + (long)local_c * 0x58 + 0x2d8) =
               *(double *)((long)in_RDI + (long)local_c * 0x58 + 0x2b8) *
               *(double *)((long)in_RDI + (long)local_c * 0x58 + 0x2c8) +
               *(double *)((long)in_RDI + (long)local_c * 0x58 + 0x2c0);
          NaPrintLog(*(char **)((long)in_RDI + (long)local_c * 0x58 + 0x2c0),
                     *(undefined8 *)((long)in_RDI + (long)local_c * 0x58 + 0x2c8),
                     (int)*(undefined8 *)((long)in_RDI + (long)local_c * 0x58 + 0x2d0),
                     *(undefined8 *)((long)in_RDI + (long)local_c * 0x58 + 0x2d8),
                     "\taverage=%g\tsigma=%g\trange: %g .. %g\n");
        }
        for (local_10 = 0;
            sVar8 = std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)
                               &in_RDI[10].pcaPorts.nItems), (ulong)(long)local_10 < sVar8;
            local_10 = local_10 + 1) {
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&in_RDI[10].pcaPorts.nItems
                              ,(long)local_10);
          iVar2 = Parameters::cellIndex((Parameters *)&in_RDI[9].pcaPorts.pHead,*pvVar9);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&in_RDI[0xb].pcaPorts.pTail
                              ,(long)local_10);
          iVar4 = Parameters::cellIndex((Parameters *)&in_RDI[10].bHalt,*pvVar9);
          iVar4 = iVar2 * *(int *)&in_RDI[10].bHalt + iVar4;
          if (*(int *)((long)in_RDI[0xc]._vptr_NaPetriNode + (long)iVar4 * 4) == 0) {
            *(int *)&in_RDI[0xc].szName = *(int *)&in_RDI[0xc].szName + 1;
          }
          *(int *)((long)in_RDI[0xc]._vptr_NaPetriNode + (long)iVar4 * 4) =
               *(int *)((long)in_RDI[0xc]._vptr_NaPetriNode + (long)iVar4 * 4) + 1;
        }
        pcVar10 = NaPetriNode::name(in_RDI);
        uVar3 = *(uint *)&in_RDI[0xc].szName;
        iVar2 = *(int *)&in_RDI[0xc].szName;
        iVar4 = *(int *)&in_RDI[9].pcaPorts.pHead;
        iVar1 = *(int *)&in_RDI[10].bHalt;
        pNVar11 = NaPetriNode::net(in_RDI);
        pNVar12 = NaPetriNet::timer(pNVar11);
        uVar5 = (*pNVar12->_vptr_NaTimer[5])();
        NaPrintLog((char *)(((double)iVar2 * 100.0) / (double)(iVar4 * iVar1)),
                   "\'%s\' has %d non-zero cells (%4.1f%%) (at %d)\n",pcVar10,(ulong)uVar3,
                   (ulong)uVar5);
      }
      else {
        sVar8 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)&in_RDI[10].pcaPorts.nItems);
        if ((ulong)(long)*(int *)((long)&in_RDI[9].pcaPorts._vptr_NaDynAr + 4) < sVar8) {
          pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff08);
          iVar2 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
          iVar2 = Parameters::cellIndex
                            ((Parameters *)&in_RDI[9].pcaPorts.pHead,
                             *(NaReal *)CONCAT44(extraout_var_06,iVar2));
          pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff08);
          iVar4 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
          iVar4 = Parameters::cellIndex
                            ((Parameters *)&in_RDI[10].bHalt,
                             *(NaReal *)CONCAT44(extraout_var_07,iVar4));
          iVar4 = iVar2 * *(int *)&in_RDI[10].bHalt + iVar4;
          if (*(int *)((long)in_RDI[0xc]._vptr_NaPetriNode + (long)iVar4 * 4) == 0) {
            *(int *)&in_RDI[0xc].szName = *(int *)&in_RDI[0xc].szName + 1;
          }
          *(int *)((long)in_RDI[0xc]._vptr_NaPetriNode + (long)iVar4 * 4) =
               *(int *)((long)in_RDI[0xc]._vptr_NaPetriNode + (long)iVar4 * 4) + 1;
        }
      }
    }
    if (*(double *)&in_RDI[9].pcaPorts.nItems <=
        ((double)*(int *)&in_RDI[0xc].szName * 100.0) /
        (double)(*(int *)&in_RDI[9].pcaPorts.pHead * *(int *)&in_RDI[10].bHalt)) {
      pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 4));
      iVar2 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
      *(undefined8 *)CONCAT44(extraout_var_08,iVar2) = 0x3ff0000000000000;
      *(undefined1 *)&in_RDI[9].pcaPorts._vptr_NaDynAr = 0;
      pcVar10 = NaPetriNode::name(in_RDI);
      uVar3 = *(uint *)&in_RDI[0xc].szName;
      iVar2 = *(int *)&in_RDI[0xc].szName;
      iVar4 = *(int *)&in_RDI[9].pcaPorts.pHead;
      iVar1 = *(int *)&in_RDI[10].bHalt;
      pNVar11 = NaPetriNode::net(in_RDI);
      pNVar12 = NaPetriNet::timer(pNVar11);
      uVar5 = (*pNVar12->_vptr_NaTimer[5])();
      NaPrintLog((char *)(((double)iVar2 * 100.0) / (double)(iVar4 * iVar1)),
                 "\'%s\' reached %d non-zero cells (%4.1f%%) -> OFF (at %d)\n",pcVar10,(ulong)uVar3,
                 (ulong)uVar5);
      (*in_RDI->_vptr_NaPetriNode[5])();
    }
  }
  return;
}

Assistant:

void
NaPNTrainDataGath::action ()
{
  if(bTurnedOn)
    {
      par[0].vSeries.push_back(in1.data()[0]);
      par[1].vSeries.push_back(in2.data()[0]);
      /*
      NaPrintLog("'%s' gathered data at %d\n",
		 name(), net()->timer().CurrentIndex());
      */
      // Pass data through the node
      out1.data() = in1.data();
      out2.data() = in2.data();
      turnoff.data()[0] = 0;

      out1.commit_data();
      out2.commit_data();

      if(par[0].vSeries.size() < nStDetLen)
	{
	  par[0].fSum += in1.data()[0];
	  par[0].fSum2 += in1.data()[0] * in1.data()[0];

	  par[1].fSum += in2.data()[0];
	  par[1].fSum2 += in2.data()[0] * in2.data()[0];
	}
      else if(par[0].vSeries.size() == nStDetLen)
	{
	  NaPrintLog("'%s' calculated statistics (at %d):\n",
		     name(), net()->timer().CurrentIndex());
	  for(int i = 0; i < 2; ++i)
	    {
	      par[i].fAvg = par[i].fSum / par[i].vSeries.size();
	      par[i].fSigma = sqrt(par[i].fSum2 / par[i].vSeries.size()
				   - par[i].fAvg * par[i].fAvg);
	      par[i].fRange[0] = par[i].fAvg - par[i].fNSigma * par[i].fSigma;
	      par[i].fRange[1] = par[i].fAvg + par[i].fNSigma * par[i].fSigma;
	      NaPrintLog("\taverage=%g\tsigma=%g\trange: %g .. %g\n",
			 par[i].fAvg, par[i].fSigma,
			 par[i].fRange[0], par[i].fRange[1]);
	    }

	  // make classification for previous inputs
	  for(int j = 0; j < par[0].vSeries.size(); ++j)
	    {
	      int	i1 = par[0].cellIndex(par[0].vSeries[j]);
	      int	i2 = par[1].cellIndex(par[1].vSeries[j]);
	      int	i = i1 * par[1].nCells + i2;
	      if(mxHits[i] == 0)
		++nNonZeroHits;
	      ++mxHits[i];
	    }
	  NaPrintLog("'%s' has %d non-zero cells (%4.1f%%) (at %d)\n",
		     name(), nNonZeroHits,
		     100.0 * nNonZeroHits / (par[0].nCells * par[1].nCells),
		     net()->timer().CurrentIndex());
	}
      else if(par[0].vSeries.size() > nStDetLen)
	{
	  int	i1 = par[0].cellIndex(in1.data()[0]);
	  int	i2 = par[1].cellIndex(in2.data()[0]);
	  int	i = i1 * par[1].nCells + i2;
	  if(mxHits[i] == 0)
	    ++nNonZeroHits;
	  ++mxHits[i];
	}

      if(100.0 * nNonZeroHits / (par[0].nCells * par[1].nCells) >= fMinHits)
	{
	  turnoff.data()[0] = 1;
	  bTurnedOn = false;

	  NaPrintLog("'%s' reached %d non-zero cells (%4.1f%%) -> OFF (at %d)\n",
		     name(), nNonZeroHits,
		     100.0 * nNonZeroHits / (par[0].nCells * par[1].nCells),
		     net()->timer().CurrentIndex());
	  halt();
	}
    }
  else if(turnon.links() > 0)
    if(0 != turnon.data()[0])
      {
	bTurnedOn = true;

	NaPrintLog("'%s' is ON (at %d)\n",
		   name(), net()->timer().CurrentIndex());

	for(int i = 0; i < par[0].nCells * par[1].nCells; ++i)
	  mxHits[i] = 0;
	nNonZeroHits = 0;

	par[0].fSum = par[1].fSum = 0.0;
	par[0].fSum2 = par[1].fSum2 = 0.0;

	par[0].vSeries.clear();
	par[1].vSeries.clear();
      }
}